

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpr<derived_*const_&,_base_*const_&>::streamReconstructedExpression
          (BinaryExpr<derived_*const_&,_base_*const_&> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  size_t in_RCX;
  base **extraout_RDX;
  base **extraout_RDX_00;
  base **e;
  string *in_R9;
  StringRef op;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  local_60._M_dataplus._M_p = (pointer)*this->m_lhs;
  if ((derived *)local_60._M_dataplus._M_p == (derived *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"nullptr",&local_61);
    e = extraout_RDX_00;
  }
  else {
    Detail::rawMemoryToString_abi_cxx11_(&local_40,(Detail *)&local_60,(void *)0x8,in_RCX);
    e = extraout_RDX;
  }
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  Detail::stringify<C_A_T_C_H_T_E_S_T_0()::base*>(&local_60,(Detail *)this->m_rhs,e);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }